

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void deqp::egl::createRenderGroups<deqp::egl::SingleThreadRenderCase>
               (EglTestContext *eglTestCtx,TestCaseGroup *group,RenderGroupSpec *first,
               RenderGroupSpec *last)

{
  TestNode *node;
  SingleThreadRenderCase *this;
  pointer filters;
  FilterList baseFilters;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  
  if (first != last) {
    do {
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,eglTestCtx->m_testCtx,first->name,first->desc);
      tcu::TestNode::addChild(&group->super_TestNode,node);
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      eglu::FilterList::operator<<(&baseFilters,first->baseFilter);
      getDefaultRenderFilterLists(&filterLists,&baseFilters);
      for (filters = filterLists.
                     super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          filters !=
          filterLists.
          super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
          ._M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
        this = (SingleThreadRenderCase *)operator_new(0x1af0);
        SingleThreadRenderCase::SingleThreadRenderCase
                  (this,eglTestCtx,(filters->super_NamedFilterList).m_name._M_dataplus._M_p,
                   ::glcts::fixed_sample_locations_values + 1,first->apiBits,
                   filters->m_surfaceTypeMask,(FilterList *)filters,first->numContextsPerApi);
        tcu::TestNode::addChild(node,(TestNode *)this);
      }
      if (baseFilters.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(baseFilters.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)baseFilters.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)baseFilters.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
      ~vector(&filterLists);
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

static void createRenderGroups (EglTestContext& eglTestCtx, tcu::TestCaseGroup* group, const RenderGroupSpec* first, const RenderGroupSpec* last)
{
	for (const RenderGroupSpec* groupIter = first; groupIter != last; groupIter++)
	{
		tcu::TestCaseGroup* configGroup = new tcu::TestCaseGroup(eglTestCtx.getTestContext(), groupIter->name, groupIter->desc);
		group->addChild(configGroup);

		vector<RenderFilterList>	filterLists;
		eglu::FilterList			baseFilters;
		baseFilters << groupIter->baseFilter;
		getDefaultRenderFilterLists(filterLists, baseFilters);

		for (vector<RenderFilterList>::const_iterator listIter = filterLists.begin(); listIter != filterLists.end(); listIter++)
			configGroup->addChild(new RenderClass(eglTestCtx, listIter->getName(), "", groupIter->apiBits, listIter->getSurfaceTypeMask(), *listIter, groupIter->numContextsPerApi));
	}
}